

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Last.hpp
# Opt level: O3

OUT * __thiscall
linq::Last<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>>,bool,int>>
          (OUT *__return_storage_ptr__,linq *this,
          GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int> *source)

{
  char cVar1;
  out_of_range *this_00;
  undefined **local_68;
  element_type *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  bool local_50;
  _func_int **local_48;
  element_type *peStack_40;
  
  (*(code *)**(undefined8 **)this)(this);
  cVar1 = (**(code **)(*(long *)this + 8))(this);
  if (cVar1 != '\0') {
    local_48 = (__return_storage_ptr__->super_IEnumerable<int_&>).super_IState<int_&>._vptr_IState;
    peStack_40 = (__return_storage_ptr__->super_IEnumerable<int_&>).state.
                 super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    while( true ) {
      (**(code **)(*(long *)this + 0x18))(&local_68,this);
      (**(code **)(*(long *)this + 0x10))(this);
      cVar1 = (**(code **)(*(long *)this + 8))(this);
      if (cVar1 == '\0') break;
      local_68 = &PTR_Init_00157638;
      if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
      }
    }
    (__return_storage_ptr__->super_IEnumerable<int_&>).state.
    super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_60;
    (__return_storage_ptr__->super_IEnumerable<int_&>).state.
    super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_58
    ;
    __return_storage_ptr__->Key = local_50;
    (__return_storage_ptr__->super_IEnumerable<int_&>).super_IState<int_&>._vptr_IState =
         (_func_int **)&PTR_Init_001576d0;
    return __return_storage_ptr__;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"this");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

auto Last(S&& source)
	{
		source.Init();
		if(!source.Valid())
			throw std::out_of_range("this");

		while(true)
		{
			auto result = source.Current();
			source.Advance();

			if(!source.Valid())
				return result;
		}
	}